

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textureinfo.h
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
DDSHeader::ToStringArray_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,DDSHeader *this)

{
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_00;
  uint flags;
  uint flags_00;
  uint flags_01;
  uint flags_02;
  uint flags_03;
  uint flags_04;
  uint flags_05;
  uint flags_06;
  long lVar1;
  char *pcVar2;
  char *pcVar3;
  string reserved;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_58;
  string local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::to_string(&reserved,(this->impl_).pixel_format.size);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&reserved);
  std::__cxx11::string::~string((string *)&reserved);
  DDSInfo::PrintPixelFormatFlagNames_abi_cxx11_
            (&reserved,(DDSInfo *)(ulong)(this->impl_).pixel_format.flags,flags);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&reserved);
  std::__cxx11::string::~string((string *)&reserved);
  local_78._M_dataplus._M_p._0_4_ = (this->impl_).pixel_format.fourcc;
  reserved._M_string_length = 0;
  reserved.field_2._M_local_buf[0] = '\0';
  reserved._M_dataplus._M_p = (pointer)&reserved.field_2;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    std::__cxx11::string::append((char *)&reserved,(long)&local_78._M_dataplus._M_p + lVar1);
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&reserved);
  std::__cxx11::string::~string((string *)&reserved);
  std::__cxx11::to_string(&reserved,(this->impl_).pixel_format.bit_count);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&reserved);
  std::__cxx11::string::~string((string *)&reserved);
  pcVar3 = "True";
  pcVar2 = "True";
  if ((this->impl_).pixel_format.red_mask == 0) {
    pcVar2 = "False";
  }
  std::__cxx11::string::string((string *)&reserved,pcVar2,(allocator *)&local_78);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&reserved);
  std::__cxx11::string::~string((string *)&reserved);
  pcVar2 = "True";
  if ((this->impl_).pixel_format.blue_mask == 0) {
    pcVar2 = "False";
  }
  std::__cxx11::string::string((string *)&reserved,pcVar2,(allocator *)&local_78);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&reserved);
  std::__cxx11::string::~string((string *)&reserved);
  pcVar2 = "True";
  if ((this->impl_).pixel_format.green_mask == 0) {
    pcVar2 = "False";
  }
  std::__cxx11::string::string((string *)&reserved,pcVar2,(allocator *)&local_78);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&reserved);
  std::__cxx11::string::~string((string *)&reserved);
  if ((this->impl_).pixel_format.alpha_mask == 0) {
    pcVar3 = "False";
  }
  std::__cxx11::string::string((string *)&reserved,pcVar3,(allocator *)&local_78);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&reserved);
  std::__cxx11::string::~string((string *)&reserved);
  std::__cxx11::to_string(&reserved,(this->impl_).size);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&reserved);
  std::__cxx11::string::~string((string *)&reserved);
  DDSInfo::PrintDDSFlagNames_abi_cxx11_(&reserved,(DDSInfo *)(ulong)(this->impl_).flags,flags_00);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&reserved);
  std::__cxx11::string::~string((string *)&reserved);
  std::__cxx11::to_string(&reserved,(this->impl_).width);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&reserved);
  std::__cxx11::string::~string((string *)&reserved);
  std::__cxx11::to_string(&reserved,(this->impl_).height);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&reserved);
  std::__cxx11::string::~string((string *)&reserved);
  std::__cxx11::to_string(&reserved,(this->impl_).depth);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&reserved);
  std::__cxx11::string::~string((string *)&reserved);
  std::__cxx11::to_string(&reserved,(this->impl_).mip_map_count);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&reserved);
  std::__cxx11::string::~string((string *)&reserved);
  std::__cxx11::to_string(&reserved,(this->impl_).pitch_or_linear_size);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&reserved);
  std::__cxx11::string::~string((string *)&reserved);
  DDSInfo::PrintCaps1FlagNames_abi_cxx11_
            (&reserved,(DDSInfo *)(ulong)(this->impl_).capabilities1,flags_01);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&reserved);
  std::__cxx11::string::~string((string *)&reserved);
  DDSInfo::PrintCaps2FlagNames_abi_cxx11_
            (&reserved,(DDSInfo *)(ulong)(this->impl_).capabilities2,flags_02);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&reserved);
  std::__cxx11::string::~string((string *)&reserved);
  std::__cxx11::to_string(&reserved,(this->impl_).capabilities3);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&reserved);
  std::__cxx11::string::~string((string *)&reserved);
  std::__cxx11::to_string(&reserved,(this->impl_).capabilities4);
  local_58 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&reserved);
  std::__cxx11::string::~string((string *)&reserved);
  reserved._M_string_length = 0;
  reserved.field_2._M_local_buf[0] = '\0';
  reserved._M_dataplus._M_p = (pointer)&reserved.field_2;
  for (lVar1 = -0x2c; this_00 = local_58, lVar1 != 0; lVar1 = lVar1 + 4) {
    std::__cxx11::to_string(&local_50,*(uint *)((long)(this->impl_).reserved + lVar1 + 0x2c));
    std::operator+(&local_78,&local_50,':');
    std::__cxx11::string::append((string *)&reserved);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_50);
  }
  RemoveTrailingCharacter(&reserved,':');
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_00,&reserved);
  std::__cxx11::to_string(&local_78,(this->impl_).reserved2);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>(this_00,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  DDSInfo::PrintDXGIFormatFlagNames_abi_cxx11_
            (&local_78,(DDSInfo *)(ulong)(this->dx10_impl_).dxgi_format,flags_03);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>(this_00,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  DDSInfo::PrintResourceDimensionFlagNames_abi_cxx11_
            (&local_78,(DDSInfo *)(ulong)(this->dx10_impl_).resource_dimension,flags_04);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>(this_00,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::to_string(&local_78,(this->dx10_impl_).array_size);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>(this_00,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  DDSInfo::PrintTexMiscFlagNames_abi_cxx11_
            (&local_78,(DDSInfo *)(ulong)(this->dx10_impl_).misc_flags,flags_05);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>(this_00,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  DDSInfo::PrintTexMisc2FlagNames_abi_cxx11_
            (&local_78,(DDSInfo *)(ulong)(this->dx10_impl_).misc_flags_2,flags_06);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>(this_00,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&reserved);
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)this_00;
}

Assistant:

std::vector<std::string> ToStringArray() {
    std::vector<std::string> output;
    const auto& impl(this->impl_);
    const auto& dx10_impl(this->dx10_impl_);
    output.push_back(std::to_string(impl.pixel_format.size));
    output.push_back(DDSInfo::PrintPixelFormatFlagNames(impl.pixel_format.flags));
    output.push_back(FourCCToString(impl.pixel_format.fourcc));
    output.push_back(std::to_string(impl.pixel_format.bit_count));
    output.push_back(impl.pixel_format.red_mask==0?"False":"True");
    output.push_back(impl.pixel_format.blue_mask==0?"False":"True");
    output.push_back(impl.pixel_format.green_mask==0?"False":"True");
    output.push_back(impl.pixel_format.alpha_mask==0?"False":"True");
    output.push_back(std::to_string(impl.size));
    output.push_back(DDSInfo::PrintDDSFlagNames(impl.flags));
    output.push_back(std::to_string(impl.width));
    output.push_back(std::to_string(impl.height));
    output.push_back(std::to_string(impl.depth));
    output.push_back(std::to_string(impl.mip_map_count));
    output.push_back(std::to_string(impl.pitch_or_linear_size));
    output.push_back(DDSInfo::PrintCaps1FlagNames(impl.capabilities1));
    output.push_back(DDSInfo::PrintCaps2FlagNames(impl.capabilities2));
    output.push_back(std::to_string(impl.capabilities3));
    output.push_back(std::to_string(impl.capabilities4));
    std::string reserved;
    for(auto& value: impl.reserved) {
      reserved.append(std::to_string(value) + ':');
    }
    RemoveTrailingCharacter(reserved,':');
    output.push_back(reserved);
    output.push_back(std::to_string(impl.reserved2));
    // DX 10
    output.push_back(DDSInfo::PrintDXGIFormatFlagNames(dx10_impl.dxgi_format));
    output.push_back(DDSInfo::PrintResourceDimensionFlagNames(dx10_impl.resource_dimension));
    output.push_back(std::to_string(dx10_impl.array_size));
    output.push_back(DDSInfo::PrintTexMiscFlagNames(dx10_impl.misc_flags));
    output.push_back(DDSInfo::PrintTexMisc2FlagNames(dx10_impl.misc_flags_2));
    return output;
    }